

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O2

void __thiscall KDReports::Test::initTestCase(Test *this)

{
  int t;
  QDebug *pQVar1;
  QDebug local_80;
  QFontInfo info;
  QDebug local_70;
  QFont font;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  char *local_28;
  
  QCoreApplication::setAttribute(AA_Use96Dpi,true);
  QString::QString((QString *)&local_40,"Noto Sans");
  QFont::QFont(&font,(QString *)&local_40,0x30,-1,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QFontInfo::QFontInfo(&info,&font);
  QFontInfo::family();
  fontFound = QString::operator==((QString *)&local_40,"Noto Sans");
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  local_40.d = (Data *)0x3000000002;
  local_40.ptr = 
  L"/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
  ;
  local_40.size = 0x10b7f7;
  local_28 = "default";
  QMessageLogger::debug();
  pQVar1 = QDebug::operator<<((QDebug *)&local_58,"Setting DPI to 96. ");
  pQVar1 = QDebug::operator<<(pQVar1,"Noto Sans");
  pQVar1 = QDebug::operator<<(pQVar1,"48 has a size of");
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_80,&font);
  t = QFontMetrics::height();
  QDebug::operator<<(pQVar1,t);
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_80);
  QDebug::~QDebug((QDebug *)&local_58);
  local_40.d = (Data *)0x3100000002;
  local_40.ptr = 
  L"/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
  ;
  local_40.size = 0x10b7f7;
  local_28 = "default";
  QMessageLogger::debug();
  operator<<((Stream *)&local_80,(QFont *)&local_70);
  QFontInfo::family();
  QDebug::operator<<(&local_80,(QString *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QDebug::~QDebug(&local_80);
  QDebug::~QDebug(&local_70);
  QFontInfo::~QFontInfo(&info);
  QFont::~QFont(&font);
  return;
}

Assistant:

void initTestCase()
    {
        // Force the DPI do the same value as on Windows
        // (mostly for testFontScaling)
        qApp->setAttribute(Qt::AA_Use96Dpi, true);
        QFont font(s_fontName, 48);
        QFontInfo info(font);
        fontFound = (info.family() == s_fontName);
        qDebug() << "Setting DPI to 96. " << s_fontName << "48 has a size of" << QFontMetrics(font).height();
        qDebug() << font << info.family();
        // Unfortunately, Qt on Mac OSX hardcodes 72 DPI, so we'll always have different results there.
    }